

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O3

void test_arithm<unsigned_char>(uint length,uchar value1,uchar value2,bool allowTrash)

{
  char *pcVar1;
  ulong __n;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> __s;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  char cVar4;
  int iVar5;
  ulong uVar6;
  undefined8 *puVar7;
  undefined7 in_register_00000031;
  char cVar8;
  ushort uVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  shared_ptr<unsigned_char> pv1;
  shared_ptr<unsigned_char> pv2;
  shared_ptr<unsigned_char> presult;
  
  presult.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(in_register_00000031,value1);
  iVar5 = posix_memalign(&pv1.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi,0x10,(long)(int)length);
  local_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar5 == 0) {
    local_78 = pv1.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_char*,void(*)(unsigned_char*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv1,local_78,
             sse::common::free<unsigned_char>);
  iVar5 = posix_memalign(&pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi,0x10,(long)(int)length);
  pv1.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (iVar5 == 0) {
    pv1.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
         pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_char*,void(*)(unsigned_char*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv2,
             pv1.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             sse::common::free<unsigned_char>);
  iVar5 = posix_memalign(&local_80,0x10,(long)(int)(length + 1));
  if (iVar5 != 0) {
    local_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = local_80;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<unsigned_char*,void(*)(unsigned_char*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&presult,local_80,
             sse::common::free<unsigned_char>);
  _Var3._M_pi = pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  __s = pv1.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  p_Var2 = local_78;
  __n = (ulong)length;
  *(undefined1 *)
   ((long)&(pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + __n) = 0x7f;
  uVar9 = (ushort)presult.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
  if ((int)length < 1) {
    if (length == 0) goto LAB_0010adf9;
  }
  else {
    memset(local_78,(uint)presult.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi & 0xff,__n);
    memset(__s._M_pi,(uint)value2,__n);
    uVar9 = (ushort)presult.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
  }
  uVar6 = 0;
  do {
    cVar8 = (char)uVar9;
    if ((*(char *)((long)&p_Var2->_vptr__Sp_counted_base + uVar6) != cVar8) ||
       (*(uchar *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + uVar6) != value2)) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar7 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned char]";
      *(undefined4 *)(puVar7 + 1) = 0x1a;
      *(uint *)((long)puVar7 + 0xc) = length;
      __cxa_throw(puVar7,&Exception::typeinfo,0);
    }
    uVar6 = uVar6 + 1;
  } while (__n != uVar6);
  if (p_Var2 == _Var3._M_pi) {
    if (0 < (int)length) {
      uVar6 = 0;
      do {
        pcVar1 = (char *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6);
        *pcVar1 = *pcVar1 + *(char *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + uVar6);
        uVar6 = uVar6 + 1;
      } while (__n != uVar6);
    }
  }
  else if (__s._M_pi == _Var3._M_pi) {
    if (0 < (int)length) {
      uVar6 = 0;
      do {
        pcVar1 = (char *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6);
        *pcVar1 = *pcVar1 + *(char *)((long)&p_Var2->_vptr__Sp_counted_base + uVar6);
        uVar6 = uVar6 + 1;
      } while (__n != uVar6);
    }
  }
  else if (0 < (int)length) {
    uVar6 = 0;
    do {
      *(char *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) =
           *(char *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + uVar6) +
           *(char *)((long)&p_Var2->_vptr__Sp_counted_base + uVar6);
      uVar6 = uVar6 + 1;
    } while (__n != uVar6);
  }
  uVar6 = 0;
  do {
    if (*(char *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) != (uchar)(value2 + cVar8))
    {
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar7 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned char]";
      *(undefined4 *)(puVar7 + 1) = 0x22;
      *(uint *)((long)puVar7 + 0xc) = length;
      __cxa_throw(puVar7,&Exception::typeinfo,0);
    }
    uVar6 = uVar6 + 1;
  } while (__n != uVar6);
  if (p_Var2 == _Var3._M_pi) {
    if (0 < (int)length) {
      uVar6 = 0;
      do {
        pcVar1 = (char *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6);
        *pcVar1 = *pcVar1 - *(char *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + uVar6);
        uVar6 = uVar6 + 1;
      } while (__n != uVar6);
    }
  }
  else if (0 < (int)length) {
    uVar6 = 0;
    do {
      *(char *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) =
           *(char *)((long)&p_Var2->_vptr__Sp_counted_base + uVar6) -
           *(char *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + uVar6);
      uVar6 = uVar6 + 1;
    } while (__n != uVar6);
  }
  uVar6 = 0;
  do {
    if (*(char *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) != (uchar)(cVar8 - value2))
    {
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar7 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned char]";
      *(undefined4 *)(puVar7 + 1) = 0x2a;
      *(uint *)((long)puVar7 + 0xc) = length;
      __cxa_throw(puVar7,&Exception::typeinfo,0);
    }
    uVar6 = uVar6 + 1;
  } while (__n != uVar6);
  if (p_Var2 == _Var3._M_pi) {
    if (0 < (int)length) {
      uVar6 = 0;
      do {
        *(char *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) =
             *(char *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) *
             *(char *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + uVar6);
        uVar6 = uVar6 + 1;
      } while (__n != uVar6);
    }
  }
  else if (__s._M_pi == _Var3._M_pi) {
    if (0 < (int)length) {
      uVar6 = 0;
      do {
        *(char *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) =
             *(char *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) *
             *(char *)((long)&p_Var2->_vptr__Sp_counted_base + uVar6);
        uVar6 = uVar6 + 1;
      } while (__n != uVar6);
    }
  }
  else if (0 < (int)length) {
    uVar6 = 0;
    do {
      *(char *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) =
           *(char *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + uVar6) *
           *(char *)((long)&p_Var2->_vptr__Sp_counted_base + uVar6);
      uVar6 = uVar6 + 1;
    } while (__n != uVar6);
  }
  uVar6 = 0;
  do {
    if (*(char *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) != (uchar)(value2 * cVar8))
    {
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar7 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned char]";
      *(undefined4 *)(puVar7 + 1) = 0x32;
      *(uint *)((long)puVar7 + 0xc) = length;
      __cxa_throw(puVar7,&Exception::typeinfo,0);
    }
    uVar6 = uVar6 + 1;
  } while (__n != uVar6);
  cVar4 = (char)((uVar9 & 0xff) / (ushort)value2);
  if (p_Var2 == _Var3._M_pi) {
    if (0 < (int)length) {
      uVar6 = 0;
      do {
        *(byte *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) =
             *(byte *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) /
             *(byte *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + uVar6);
        uVar6 = uVar6 + 1;
      } while (__n != uVar6);
    }
  }
  else if (0 < (int)length) {
    uVar6 = 0;
    do {
      *(byte *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) =
           *(byte *)((long)&p_Var2->_vptr__Sp_counted_base + uVar6) /
           *(byte *)((long)&(__s._M_pi)->_vptr__Sp_counted_base + uVar6);
      uVar6 = uVar6 + 1;
    } while (__n != uVar6);
  }
  uVar6 = 0;
  do {
    if (*(char *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) != cVar4) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar7 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned char]";
      *(undefined4 *)(puVar7 + 1) = 0x3a;
      *(uint *)((long)puVar7 + 0xc) = length;
      __cxa_throw(puVar7,&Exception::typeinfo,0);
    }
    uVar6 = uVar6 + 1;
  } while (__n != uVar6);
  if (p_Var2 == _Var3._M_pi) {
    if (0 < (int)length) {
      uVar6 = 0;
      do {
        pcVar1 = (char *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6);
        *pcVar1 = *pcVar1 + value2;
        uVar6 = uVar6 + 1;
      } while (__n != uVar6);
    }
  }
  else if (0 < (int)length) {
    uVar6 = 0;
    do {
      *(uchar *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) =
           *(char *)((long)&p_Var2->_vptr__Sp_counted_base + uVar6) + value2;
      uVar6 = uVar6 + 1;
    } while (__n != uVar6);
  }
  uVar6 = 0;
  do {
    if (*(char *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) != (uchar)(value2 + cVar8))
    {
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar7 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned char]";
      *(undefined4 *)(puVar7 + 1) = 0x43;
      *(uint *)((long)puVar7 + 0xc) = length;
      __cxa_throw(puVar7,&Exception::typeinfo,0);
    }
    uVar6 = uVar6 + 1;
  } while (__n != uVar6);
  if (p_Var2 == _Var3._M_pi) {
    if (0 < (int)length) {
      uVar6 = 0;
      do {
        pcVar1 = (char *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6);
        *pcVar1 = *pcVar1 - value2;
        uVar6 = uVar6 + 1;
      } while (__n != uVar6);
    }
  }
  else if (0 < (int)length) {
    uVar6 = 0;
    do {
      *(uchar *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) =
           *(char *)((long)&p_Var2->_vptr__Sp_counted_base + uVar6) - value2;
      uVar6 = uVar6 + 1;
    } while (__n != uVar6);
  }
  uVar6 = 0;
  do {
    if (*(char *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) != (uchar)(cVar8 - value2))
    {
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar7 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned char]";
      *(undefined4 *)(puVar7 + 1) = 0x4b;
      *(uint *)((long)puVar7 + 0xc) = length;
      __cxa_throw(puVar7,&Exception::typeinfo,0);
    }
    uVar6 = uVar6 + 1;
  } while (__n != uVar6);
  if (0 < (int)length) {
    uVar6 = 0;
    do {
      *(uchar *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) =
           value2 - *(char *)((long)&p_Var2->_vptr__Sp_counted_base + uVar6);
      uVar6 = uVar6 + 1;
    } while (__n != uVar6);
  }
  uVar6 = 0;
  do {
    if (*(char *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) != (uchar)(value2 - cVar8))
    {
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar7 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned char]";
      *(undefined4 *)(puVar7 + 1) = 0x53;
      *(uint *)((long)puVar7 + 0xc) = length;
      __cxa_throw(puVar7,&Exception::typeinfo,0);
    }
    uVar6 = uVar6 + 1;
  } while (__n != uVar6);
  if (p_Var2 == _Var3._M_pi) {
    if (0 < (int)length) {
      uVar6 = 0;
      do {
        *(uchar *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) =
             *(char *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) * value2;
        uVar6 = uVar6 + 1;
      } while (__n != uVar6);
    }
  }
  else if (0 < (int)length) {
    uVar6 = 0;
    do {
      *(uchar *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) =
           *(char *)((long)&p_Var2->_vptr__Sp_counted_base + uVar6) * value2;
      uVar6 = uVar6 + 1;
    } while (__n != uVar6);
  }
  uVar6 = 0;
  do {
    if (*(char *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) != (uchar)(value2 * cVar8))
    {
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar7 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned char]";
      *(undefined4 *)(puVar7 + 1) = 0x5b;
      *(uint *)((long)puVar7 + 0xc) = length;
      __cxa_throw(puVar7,&Exception::typeinfo,0);
    }
    uVar6 = uVar6 + 1;
  } while (__n != uVar6);
  if (p_Var2 == _Var3._M_pi) {
    if (0 < (int)length) {
      uVar6 = 0;
      do {
        *(byte *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) =
             *(byte *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) / value2;
        uVar6 = uVar6 + 1;
      } while (__n != uVar6);
    }
  }
  else if (0 < (int)length) {
    uVar6 = 0;
    do {
      *(byte *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) =
           *(byte *)((long)&p_Var2->_vptr__Sp_counted_base + uVar6) / value2;
      uVar6 = uVar6 + 1;
    } while (__n != uVar6);
  }
  uVar6 = 0;
  do {
    if (*(char *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) != cVar4) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar7 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned char]";
      *(undefined4 *)(puVar7 + 1) = 99;
      *(uint *)((long)puVar7 + 0xc) = length;
      __cxa_throw(puVar7,&Exception::typeinfo,0);
    }
    uVar6 = uVar6 + 1;
  } while (__n != uVar6);
  if (0 < (int)length) {
    uVar6 = 0;
    do {
      *(byte *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) =
           value2 / *(byte *)((long)&p_Var2->_vptr__Sp_counted_base + uVar6);
      uVar6 = uVar6 + 1;
    } while (__n != uVar6);
  }
  uVar6 = 0;
  do {
    if (*(char *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + uVar6) !=
        (char)((ushort)value2 / (uVar9 & 0xff))) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar7 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned char]";
      *(undefined4 *)(puVar7 + 1) = 0x6b;
      *(uint *)((long)puVar7 + 0xc) = length;
      __cxa_throw(puVar7,&Exception::typeinfo,0);
    }
    uVar6 = uVar6 + 1;
  } while (__n != uVar6);
LAB_0010adf9:
  if ((!allowTrash) && (*(char *)((long)&(_Var3._M_pi)->_vptr__Sp_counted_base + __n) != '\x7f')) {
    puVar7 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar7 = "void test_arithm(unsigned int, T, T, bool) [T = unsigned char]";
    *(undefined4 *)(puVar7 + 1) = 0x70;
    *(uint *)((long)puVar7 + 0xc) = length;
    __cxa_throw(puVar7,&Exception::typeinfo,0);
  }
  if (presult.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               presult.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv2.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv1.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv1.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}